

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)1,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)7,_(moira::Size)2> dst;
  Ea<(moira::Mode)7,_(moira::Size)2> local_2c;
  
  local_2c.reg = op >> 9 & 7;
  local_2c.pc = *addr;
  *addr = local_2c.pc + 2;
  local_2c.ext1 = (*this->_vptr_Moira[5])();
  local_2c.ext1 = local_2c.ext1 & 0xffff;
  pcVar5 = "move";
  if (str->upper != false) {
    pcVar5 = "MOVE";
  }
  cVar4 = *pcVar5;
  while (cVar4 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar5;
  }
  if (str->upper == false) {
    cVar4 = '.';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".w"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  else {
    cVar4 = '.';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = ".W"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  cVar4 = ',';
  lVar6 = 0;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar4;
    cVar4 = "), "[lVar6 + 2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  StrWriter::operator<<(str,&local_2c);
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}